

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serverbrowser_filter.cpp
# Opt level: O0

void __thiscall CServerFilterInfo::Set(CServerFilterInfo *this,CServerFilterInfo *pSrc)

{
  undefined4 *in_RSI;
  char *in_RDI;
  int i;
  undefined7 in_stack_ffffffffffffffd8;
  undefined1 in_stack_ffffffffffffffdf;
  int local_14;
  
  *(undefined4 *)in_RDI = *in_RSI;
  *(undefined4 *)(in_RDI + 4) = in_RSI[1];
  *(undefined4 *)(in_RDI + 8) = in_RSI[2];
  *(undefined4 *)(in_RDI + 0xc) = in_RSI[3];
  for (local_14 = 0; local_14 < 8; local_14 = local_14 + 1) {
    str_copy(in_RDI,(char *)CONCAT17(in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd8),0);
    in_stack_ffffffffffffffdf = false;
    if (in_RDI[(long)local_14 * 0x10 + 0x10] != '\0') {
      in_stack_ffffffffffffffdf = *(char *)((long)in_RSI + (long)local_14 + 0x90) != '\0';
    }
    in_RDI[(long)local_14 + 0x90] = in_stack_ffffffffffffffdf;
  }
  str_copy(in_RDI,(char *)CONCAT17(in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd8),0);
  return;
}

Assistant:

void CServerFilterInfo::Set(const CServerFilterInfo *pSrc)
{
	m_SortHash = pSrc->m_SortHash;
	m_Ping = pSrc->m_Ping;
	m_Country = pSrc->m_Country;
	m_ServerLevel = pSrc->m_ServerLevel;
	for(int i = 0; i < CServerFilterInfo::MAX_GAMETYPES; ++i)
	{
		str_copy(m_aGametype[i], pSrc->m_aGametype[i], sizeof(m_aGametype[i]));
		m_aGametypeExclusive[i] = m_aGametype[i][0] && pSrc->m_aGametypeExclusive[i];
	}
	str_copy(m_aAddress, pSrc->m_aAddress, sizeof(m_aAddress));
}